

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

void appendBasicRowsToBasis(HighsLp *lp,HighsBasis *highs_basis,HighsInt XnumNewRow)

{
  int iVar1;
  reference pvVar2;
  int in_EDX;
  byte *in_RSI;
  size_type in_RDI;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *unaff_retaddr;
  HighsInt iRow;
  HighsInt newNumRow;
  int local_1c;
  
  if ((*in_RSI & 1) == 0) {
    printf("\n!!Appending columns to invalid basis!!\n\n");
  }
  if (in_EDX != 0) {
    iVar1 = *(int *)(in_RDI + 4);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(unaff_retaddr,in_RDI);
    for (local_1c = *(int *)(in_RDI + 4); local_1c < iVar1 + in_EDX; local_1c = local_1c + 1) {
      pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RSI + 0x48),(long)local_1c);
      *pvVar2 = kBasic;
    }
  }
  return;
}

Assistant:

void appendBasicRowsToBasis(HighsLp& lp, HighsBasis& highs_basis,
                            HighsInt XnumNewRow) {
  assert(highs_basis.valid);
  if (!highs_basis.valid) {
    printf("\n!!Appending columns to invalid basis!!\n\n");
  }
  // Add basic logicals
  if (XnumNewRow == 0) return;
  HighsInt newNumRow = lp.num_row_ + XnumNewRow;
  highs_basis.row_status.resize(newNumRow);
  // Make the new rows basic
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
    highs_basis.row_status[iRow] = HighsBasisStatus::kBasic;
  }
}